

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O2

string * ANSsint<160u>::name_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_49;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"ANSsint-",&local_49);
  std::__cxx11::to_string(&local_48,0xa0);
  std::operator+(in_RDI,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

static std::string name()
    {
        return std::string("ANSsint-") + std::to_string(H_approx);
    }